

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O1

TiXmlString __thiscall despot::util::tinyxml::operator+(tinyxml *this,TiXmlString *a,char *b)

{
  size_t len;
  
  *(undefined8 **)this = &TiXmlString::nullrep_;
  len = strlen(b);
  TiXmlString::reserve((TiXmlString *)this,a->rep_->size + len);
  TiXmlString::append((TiXmlString *)this,a->rep_->str,a->rep_->size);
  TiXmlString::append((TiXmlString *)this,b,len);
  return (TiXmlString)(Rep *)this;
}

Assistant:

TiXmlString operator +(const TiXmlString & a, const char* b) {
	TiXmlString tmp;
	TiXmlString::size_type b_len =
		static_cast<TiXmlString::size_type>(strlen(b));
	tmp.reserve(a.length() + b_len);
	tmp += a;
	tmp.append(b, b_len);
	return tmp;
}